

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

bool P_CheckNodes(MapData *map,bool rebuilt,int buildtime)

{
  float fVar1;
  undefined4 uVar2;
  fixed_t fVar3;
  vertex_t *pvVar4;
  vertex_t *pvVar5;
  line_t_conflict *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  undefined4 *__ptr;
  FILE *__s;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  vertex_t **ppvVar15;
  undefined1 uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  undefined7 in_register_00000031;
  int j;
  int k;
  long lVar21;
  long lVar22;
  double dVar23;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> polyspots;
  FNodeBuilder builder;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> anchors;
  uLongf outlen;
  int local_68;
  side_t *local_60;
  int local_58;
  line_t_conflict *local_50;
  int local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  
  if ((int)CONCAT71(in_register_00000031,rebuilt) == 0) {
    bVar7 = P_CheckForGLNodes();
    if (!bVar7) {
      if (0 < (long)numsubsectors) {
        lVar10 = 0;
        do {
          *(undefined8 *)((long)&gamesubsectors->sector + lVar10) =
               **(undefined8 **)(*(long *)((long)&gamesubsectors->firstline + lVar10) + 0x10);
          lVar10 = lVar10 + 0x30;
        } while ((long)numsubsectors * 0x30 != lVar10);
      }
      nodes = (node_t *)0x0;
      numnodes = 0;
      subsectors = (subsector_t *)0x0;
      numsubsectors = 0;
      if (segs != (seg_t *)0x0) {
        operator_delete__(segs);
      }
      segs = (seg_t *)0x0;
      numsegs = 0;
      bVar7 = P_LoadGLNodes(map);
      bVar20 = true;
      if (!bVar7) {
        uVar17 = I_FPSTime();
        polyspots.Array = (FPolyStart *)0x0;
        polyspots.Most = 0;
        polyspots.Count = 0;
        anchors.Array = (FPolyStart *)0x0;
        anchors.Most = 0;
        anchors.Count = 0;
        P_GetPolySpots(map,&polyspots,&anchors);
        outlen = (uLongf)vertexes;
        local_68 = numvertexes;
        local_60 = sides;
        local_58 = numsides;
        local_50 = lines;
        local_48 = numlines;
        local_44._0_4_ = 0;
        local_44._4_4_ = 0;
        uStack_3c._0_4_ = 0;
        uStack_3c._4_4_ = 0;
        FNodeBuilder::FLevel::FindMapBounds((FLevel *)&outlen);
        FNodeBuilder::FNodeBuilder(&builder,(FLevel *)&outlen,&polyspots,&anchors,true);
        if (vertexes != (vertex_t *)0x0) {
          operator_delete__(vertexes);
        }
        FNodeBuilder::Extract
                  (&builder,&nodes,&numnodes,&segs,&glsegextras,&numsegs,&subsectors,&numsubsectors,
                   &vertexes,&numvertexes);
        uVar8 = I_FPSTime();
        buildtime = uVar8 - uVar17;
        bVar20 = true;
        DPrintf(3,"BSP generation took %.3f sec (%d segs)\n",
                SUB84((double)(uint)buildtime * 0.001,0),(ulong)(uint)numsegs);
        FNodeBuilder::~FNodeBuilder(&builder);
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&anchors);
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&polyspots);
      }
      goto LAB_003f9b0f;
    }
  }
  bVar7 = false;
  bVar20 = false;
LAB_003f9b0f:
  if (bVar7 == false) {
    if (((level.maptype == MAPTYPE_BUILD) || (gl_cachenodes.Value != true)) ||
       ((float)buildtime / 1000.0 < gl_cachetime.Value)) {
      DPrintf(3,"Not caching nodes (time = %f)\n",SUB84((double)((float)buildtime / 1000.0),0));
    }
    else {
      DPrintf(3,"Caching nodes\n");
      builder.VertexMap = (IVertexMap *)0x0;
      builder.OldVertexTable = (int *)0x0;
      TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4)
      ;
      lVar10 = (long)(int)builder.OldVertexTable._4_4_;
      builder.OldVertexTable =
           (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
      *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = 0;
      *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) = 0;
      *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) = 0;
      *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) = 0;
      iVar9 = numvertexes;
      TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4)
      ;
      lVar10 = (long)(int)builder.OldVertexTable._4_4_;
      builder.OldVertexTable =
           (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = (char)iVar9;
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
           (char)((uint)iVar9 >> 8);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
           (char)((uint)iVar9 >> 0x10);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
           (char)((uint)iVar9 >> 0x18);
      if (0 < numvertexes) {
        lVar21 = 0;
        lVar10 = 0;
        do {
          dVar23 = *(double *)((long)&(vertexes->p).X + lVar21);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          dVar23 = dVar23 + 103079215104.0;
          uVar18 = (ulong)dVar23 & 0xffffffff;
          lVar12 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12) = (char)uVar18;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 1) = (char)(uVar18 >> 8)
          ;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 2) =
               (char)(uVar18 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 3) =
               (char)((ulong)dVar23 >> 0x18);
          dVar23 = *(double *)((long)&(vertexes->p).Y + lVar21);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          dVar23 = dVar23 + 103079215104.0;
          lVar12 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12) = SUB81(dVar23,0);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 1) =
               (char)((ulong)dVar23 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 2) =
               (char)((ulong)dVar23 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 3) =
               (char)((ulong)dVar23 >> 0x18);
          lVar10 = lVar10 + 1;
          lVar21 = lVar21 + 0x10;
        } while (lVar10 < numvertexes);
      }
      iVar9 = numsubsectors;
      TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4)
      ;
      lVar10 = (long)(int)builder.OldVertexTable._4_4_;
      builder.OldVertexTable =
           (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = (char)iVar9;
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
           (char)((uint)iVar9 >> 8);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
           (char)((uint)iVar9 >> 0x10);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
           (char)((uint)iVar9 >> 0x18);
      if (0 < numsubsectors) {
        lVar21 = 0x28;
        lVar10 = 0;
        do {
          uVar2 = *(undefined4 *)((long)&subsectors->sector + lVar21);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar12 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12) = (char)uVar2;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 1) =
               (char)((uint)uVar2 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 2) =
               (char)((uint)uVar2 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar12 + 3) =
               (char)((uint)uVar2 >> 0x18);
          lVar10 = lVar10 + 1;
          lVar21 = lVar21 + 0x30;
        } while (lVar10 < numsubsectors);
      }
      iVar9 = numsegs;
      TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4)
      ;
      lVar10 = (long)(int)builder.OldVertexTable._4_4_;
      builder.OldVertexTable =
           (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = (char)iVar9;
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
           (char)((uint)iVar9 >> 8);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
           (char)((uint)iVar9 >> 0x10);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
           (char)((uint)iVar9 >> 0x18);
      if (0 < numsegs) {
        lVar12 = 0;
        lVar21 = 0;
        lVar10 = 0;
        do {
          pvVar5 = vertexes;
          lVar13 = *(long *)((long)&segs->v1 + lVar21);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          uVar18 = lVar13 - (long)pvVar5;
          lVar13 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)(uVar18 >> 4);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
               (char)(uVar18 >> 0xc);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
               (char)(uVar18 >> 0x14);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
               (char)(uVar18 >> 0x1c);
          if (glsegextras == (glsegextra_t *)0x0) {
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
            lVar13 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
            uVar16 = 0;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = 0;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) = 0;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) = 0;
          }
          else {
            uVar2 = *(undefined4 *)((long)&glsegextras->PartnerSeg + lVar12);
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
            lVar13 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)uVar2;
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
                 (char)((uint)uVar2 >> 8);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
                 (char)((uint)uVar2 >> 0x10);
            uVar16 = (undefined1)((uint)uVar2 >> 0x18);
          }
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) = uVar16;
          plVar6 = lines;
          lVar13 = *(long *)((long)&segs->linedef + lVar21);
          if (lVar13 == 0) {
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
            lVar13 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = 0xff;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) = 0xff;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) = 0xff;
            *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) = 0xff;
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,1);
            bVar7 = false;
          }
          else {
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
            lVar19 = (lVar13 - (long)plVar6 >> 3) * -0x79435e50d79435e5;
            lVar13 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)lVar19;
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
                 (char)((ulong)lVar19 >> 8);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
                 (char)((ulong)lVar19 >> 0x10);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
                 (char)((ulong)lVar19 >> 0x18);
            lVar13 = *(long *)((long)&segs->sidedef + lVar21);
            lVar19 = *(long *)(*(long *)((long)&segs->linedef + lVar21) + 0x48);
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,1);
            bVar7 = lVar13 != lVar19;
          }
          *(bool *)((long)&(builder.VertexMap)->_vptr_IVertexMap +
                   (ulong)builder.OldVertexTable._4_4_) = bVar7;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 1,builder.OldVertexTable._0_4_);
          lVar10 = lVar10 + 1;
          lVar21 = lVar21 + 0x30;
          lVar12 = lVar12 + 0x10;
        } while (lVar10 < numsegs);
      }
      iVar9 = numnodes;
      TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4)
      ;
      lVar10 = (long)(int)builder.OldVertexTable._4_4_;
      builder.OldVertexTable =
           (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = (char)iVar9;
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
           (char)((uint)iVar9 >> 8);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
           (char)((uint)iVar9 >> 0x10);
      *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
           (char)((uint)iVar9 >> 0x18);
      if (0 < numnodes) {
        lVar12 = 0x10;
        lVar21 = 0x38;
        lVar10 = 0;
        do {
          fVar3 = nodes[lVar10].x;
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar13 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)fVar3;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
               (char)((uint)fVar3 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
               (char)((uint)fVar3 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
               (char)((uint)fVar3 >> 0x18);
          fVar3 = nodes[lVar10].y;
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar13 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)fVar3;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
               (char)((uint)fVar3 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
               (char)((uint)fVar3 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
               (char)((uint)fVar3 >> 0x18);
          fVar3 = nodes[lVar10].dx;
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar13 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)fVar3;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
               (char)((uint)fVar3 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
               (char)((uint)fVar3 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
               (char)((uint)fVar3 >> 0x18);
          fVar3 = nodes[lVar10].dy;
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar13 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13) = (char)fVar3;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 1) =
               (char)((uint)fVar3 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 2) =
               (char)((uint)fVar3 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar13 + 3) =
               (char)((uint)fVar3 >> 0x18);
          lVar13 = 0;
          lVar19 = lVar12;
          do {
            lVar22 = 0;
            do {
              fVar1 = *(float *)((long)&nodes->x + lVar22 * 4 + lVar19);
              TArray<unsigned_char,_unsigned_char>::Grow
                        ((TArray<unsigned_char,_unsigned_char> *)&builder,2);
              iVar9 = (int)fVar1;
              lVar14 = (long)(int)builder.OldVertexTable._4_4_;
              builder.OldVertexTable =
                   (int *)CONCAT44(builder.OldVertexTable._4_4_ + 2,builder.OldVertexTable._0_4_);
              *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar14) = (char)iVar9;
              *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar14 + 1) =
                   (char)((uint)iVar9 >> 8);
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            lVar19 = lVar19 + 0x10;
            bVar7 = lVar13 == 0;
            lVar13 = lVar13 + 1;
          } while (bVar7);
          lVar13 = 0;
          do {
            uVar18 = *(ulong *)((long)&nodes->x + lVar13 * 8 + lVar21);
            if ((uVar18 & 1) == 0) {
              uVar17 = (int)(uVar18 - (long)nodes >> 3) * 0x38e38e39;
            }
            else {
              uVar17 = (int)(~(ulong)subsectors + uVar18 >> 4) * -0x55555555 | 0x80000000;
            }
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
            lVar19 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)uVar17;
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) =
                 (char)(uVar17 >> 8);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
                 (char)(uVar17 >> 0x10);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
                 (char)(uVar17 >> 0x18);
            lVar13 = lVar13 + 1;
          } while (lVar13 == 1);
          lVar10 = lVar10 + 1;
          lVar12 = lVar12 + 0x48;
          lVar21 = lVar21 + 0x48;
        } while (lVar10 < numnodes);
      }
      outlen = (ulong)builder.OldVertexTable >> 0x20;
      lVar21 = (long)numlines;
      lVar10 = lVar21 * 8 + 0x1c;
      while( true ) {
        __ptr = (undefined4 *)operator_new__(outlen + lVar10);
        iVar9 = compress(__ptr + lVar21 * 2 + 7,&outlen,builder.VertexMap,
                         builder.OldVertexTable._4_4_);
        if (iVar9 != -5) break;
        operator_delete__(__ptr);
        outlen = outlen + 0x400;
      }
      *__ptr = 0x48434143;
      __ptr[1] = numlines;
      MapData::GetChecksum(map,(BYTE *)(__ptr + 2));
      pvVar5 = vertexes;
      lVar12 = (long)numlines;
      if (0 < lVar12) {
        ppvVar15 = &lines->v2;
        lVar13 = 0;
        do {
          pvVar4 = *ppvVar15;
          __ptr[lVar13 * 2 + 6] =
               (int)((ulong)((long)((line_t_conflict *)(ppvVar15 + -1))->v1 - (long)pvVar5) >> 4);
          __ptr[lVar13 * 2 + 7] = (int)((ulong)((long)pvVar4 - (long)pvVar5) >> 4);
          lVar13 = lVar13 + 1;
          ppvVar15 = ppvVar15 + 0x13;
        } while (lVar12 != lVar13);
      }
      (__ptr + lVar21 * 2 + 7)[-1] = 0x334c475a;
      CreateCacheName((MapData *)&polyspots,SUB81(map,0));
      __s = fopen((char *)polyspots.Array,"wb");
      if (__s == (FILE *)0x0) {
        Printf("Cannot open nodes file %s for writing\n",polyspots.Array);
      }
      else {
        sVar11 = fwrite(__ptr,lVar10 + outlen,1,__s);
        if (sVar11 != 1) {
          Printf("Error saving nodes to file %s\n",polyspots.Array);
        }
        fclose(__s);
      }
      operator_delete__(__ptr);
      FString::~FString((FString *)&polyspots);
      TArray<unsigned_char,_unsigned_char>::~TArray
                ((TArray<unsigned_char,_unsigned_char> *)&builder);
    }
  }
  if (gamenodes == (node_t *)0x0) {
    gamenodes = nodes;
    numgamenodes = numnodes;
    gamesubsectors = subsectors;
    numgamesubsectors = numsubsectors;
  }
  return bVar20;
}

Assistant:

bool P_CheckNodes(MapData * map, bool rebuilt, int buildtime)
{
	bool ret = false;
	bool loaded = false;

	// If the map loading code has performed a node rebuild we don't need to check for it again.
	if (!rebuilt && !P_CheckForGLNodes())
	{
		ret = true;	// we are not using the level's original nodes if we get here.
		for (int i = 0; i < numsubsectors; i++)
		{
			gamesubsectors[i].sector = gamesubsectors[i].firstline->sidedef->sector;
		}

		nodes = NULL;
		numnodes = 0;
		subsectors = NULL;
		numsubsectors = 0;
		if (segs) delete [] segs;
		segs = NULL;
		numsegs = 0;

		// Try to load GL nodes (cached or GWA)
		loaded = P_LoadGLNodes(map);
		if (!loaded)
		{
			// none found - we have to build new ones!
			unsigned int startTime, endTime;

			startTime = I_FPSTime ();
			TArray<FNodeBuilder::FPolyStart> polyspots, anchors;
			P_GetPolySpots (map, polyspots, anchors);
			FNodeBuilder::FLevel leveldata =
			{
				vertexes, numvertexes,
				sides, numsides,
				lines, numlines,
				0, 0, 0, 0
			};
			leveldata.FindMapBounds ();
			FNodeBuilder builder (leveldata, polyspots, anchors, true);
			delete[] vertexes;
			builder.Extract (nodes, numnodes,
				segs, glsegextras, numsegs,
				subsectors, numsubsectors,
				vertexes, numvertexes);
			endTime = I_FPSTime ();
			DPrintf (DMSG_NOTIFY, "BSP generation took %.3f sec (%d segs)\n", (endTime - startTime) * 0.001, numsegs);
			buildtime = endTime - startTime;
		}
	}

	if (!loaded)
	{
#ifdef DEBUG
		// Building nodes in debug is much slower so let's cache them only if cachetime is 0
		buildtime = 0;
#endif
		if (level.maptype != MAPTYPE_BUILD && gl_cachenodes && buildtime/1000.f >= gl_cachetime)
		{
			DPrintf(DMSG_NOTIFY, "Caching nodes\n");
			CreateCachedNodes(map);
		}
		else
		{
			DPrintf(DMSG_NOTIFY, "Not caching nodes (time = %f)\n", buildtime/1000.f);
		}
	}

	if (!gamenodes)
	{
		gamenodes = nodes;
		numgamenodes = numnodes;
		gamesubsectors = subsectors;
		numgamesubsectors = numsubsectors;
	}
	return ret;
}